

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::RegExprNFAParseHandler::Reduce
          (RegExprNFAParseHandler *this,Parse<SGParser::Generator::RegExprNFAParseElement> *parse,
          uint productionID)

{
  RegExprDataType RVar1;
  Lex *pLVar2;
  anon_union_8_3_bb83494e_for_RegExprNFAParseElement_3 aVar3;
  const_iterator *this_00;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  size_type sVar8;
  reference pvVar9;
  size_type sVar10;
  undefined8 uVar11;
  pointer ppVar12;
  undefined8 uVar13;
  NFA *pNVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar15;
  RegExprNFAParseElement *pRVar16;
  uint local_1d8;
  uint local_1d4;
  uint code_3;
  uint code2_1;
  uint code_2;
  uint code2;
  uint code_1;
  uint code;
  NFA *pnfa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  type *local_170;
  type *_;
  type *name;
  _Self local_158;
  const_iterator __end5;
  const_iterator __begin5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *__range5;
  string names;
  _Self local_118;
  _Self *local_110;
  const_iterator *iter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *map;
  uint *ord;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  String macroName;
  ulong uStack_b8;
  uint j_1;
  size_t i_1;
  undefined1 local_a8 [3];
  bool f;
  uint k_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pgroupSet_1;
  ulong uStack_80;
  uint j;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pgroupSet;
  undefined1 local_50 [4];
  uint k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList;
  uint productionID_local;
  Parse<SGParser::Generator::RegExprNFAParseElement> *parse_local;
  RegExprNFAParseHandler *this_local;
  
  if (productionID - 1 < 0x13 || productionID == 0x14) {
    switch((long)&switchD_0019130d::switchdataD_001ab928 +
           (long)(int)(&switchD_0019130d::switchdataD_001ab928)[productionID - 1]) {
    case 0x19130f:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pNVar14 = (pRVar16->field_1).pNFA;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      NFA::Concat(pNVar14,(pRVar16->field_1).pNFA);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      RegExprNFAParseElement::Destroy(pRVar16);
      break;
    case 0x191360:
      break;
    case 0x191365:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pNVar14 = (pRVar16->field_1).pNFA;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
      NFA::Or(pNVar14,(pRVar16->field_1).pNFA);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
      RegExprNFAParseElement::Destroy(pRVar16);
      break;
    case 0x1913b6:
      break;
    case 0x1913bb:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      NFA::Kleene((pRVar16->field_1).pNFA,ConnectBoth);
      break;
    case 0x1913db:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      NFA::Kleene((pRVar16->field_1).pNFA,ConnectBack);
      break;
    case 0x1913fb:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      NFA::Kleene((pRVar16->field_1).pNFA,ConnectEmpty);
      break;
    case 0x191418:
      break;
    case 0x19141d:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      aVar3 = pRVar16->field_1;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->field_1 = aVar3;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      RVar1 = pRVar16->DataType;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = RVar1;
      break;
    case 0x191480:
      pNVar14 = (NFA *)operator_new(0x28);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      NFA::NFA(pNVar14,(pRVar16->field_1).ch,this->LexemeID);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pNFA = pNVar14;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = NFA;
      break;
    case 0x19151c:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0xfd);
      for (pgroupSet._4_4_ = 1; pgroupSet._4_4_ < 0x100; pgroupSet._4_4_ = pgroupSet._4_4_ + 1) {
        if ((pgroupSet._4_4_ != 10) && (pgroupSet._4_4_ != 0xd)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                     (value_type_conflict2 *)((long)&pgroupSet + 4));
        }
      }
      pNVar14 = (NFA *)operator_new(0x28);
      NFA::NFA(pNVar14,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
               this->LexemeID);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pNFA = pNVar14;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = NFA;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      break;
    case 0x19163e:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      charList_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &((pRVar16->field_1).pNFA)->LexemeId;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      for (uStack_80 = 0; uVar6 = uStack_80,
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             charList_1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage), uVar6 < sVar8;
          uStack_80 = uStack_80 + 2) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            charList_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,uStack_80);
        for (pgroupSet_1._4_4_ = *pvVar9; uVar5 = pgroupSet_1._4_4_,
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                charList_1.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_80 + 1),
            uVar5 <= *pvVar9; pgroupSet_1._4_4_ = pgroupSet_1._4_4_ + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                     (value_type_conflict2 *)((long)&pgroupSet_1 + 4));
        }
      }
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      RegExprNFAParseElement::Destroy(pRVar16);
      pNVar14 = (NFA *)operator_new(0x28);
      NFA::NFA(pNVar14,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,this->LexemeID);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pNFA = pNVar14;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = NFA;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      break;
    case 0x1917da:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
      charList_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &((pRVar16->field_1).pNFA)->LexemeId;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
      for (i_1._4_4_ = 1; i_1._4_4_ < 0x100; i_1._4_4_ = i_1._4_4_ + 1) {
        i_1._3_1_ = 0;
        for (uStack_b8 = 0;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               charList_2.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), uStack_b8 < sVar8
            ; uStack_b8 = uStack_b8 + 2) {
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              charList_2.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_b8);
          for (macroName.field_2._12_4_ = *pvVar9; uVar4 = macroName.field_2._12_4_,
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  charList_2.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_b8 + 1),
              (uint)uVar4 <= *pvVar9; macroName.field_2._12_4_ = macroName.field_2._12_4_ + 1) {
            if (macroName.field_2._12_4_ == i_1._4_4_) {
              i_1._3_1_ = 1;
            }
          }
        }
        if ((i_1._3_1_ & 1) == 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,
                     (value_type_conflict2 *)((long)&i_1 + 4));
        }
      }
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
      RegExprNFAParseElement::Destroy(pRVar16);
      pNVar14 = (NFA *)operator_new(0x28);
      NFA::NFA(pNVar14,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,
               this->LexemeID);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pNFA = pNVar14;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = NFA;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
      break;
    case 0x191a0d:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      if ((pRVar16->field_1).pNFA == (NFA *)0x0) {
        __assert_fail("parse[1].pVec",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0xe0,
                      "virtual bool SGParser::Generator::RegExprNFAParseHandler::Reduce(Parse<RegExprNFAParseElement> &, unsigned int)"
                     );
      }
      std::__cxx11::string::string((string *)&__range4);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size((pRVar16->field_1).pVec);
      std::__cxx11::string::reserve((ulong)&__range4);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      pvVar15 = (pRVar16->field_1).pVec;
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar15);
      ord = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar15);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&ord), bVar7) {
        map = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
               *)__gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        std::__cxx11::string::push_back((char)&__range4);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      RegExprNFAParseElement::Destroy(pRVar16);
      if (this->pMacroNFAs ==
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
           *)0x0) {
        __assert_fail("pMacroNFAs != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0xeb,
                      "virtual bool SGParser::Generator::RegExprNFAParseHandler::Reduce(Parse<RegExprNFAParseElement> &, unsigned int)"
                     );
      }
      iter = (const_iterator *)this->pMacroNFAs;
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                   *)iter,(key_type *)&__range4);
      local_110 = &local_118;
      names.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                  *)iter);
      bVar7 = std::operator==(&local_118,(_Self *)((long)&names.field_2 + 8));
      if (bVar7) {
        std::__cxx11::string::string((string *)&__range5);
        this_00 = iter;
        __end5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                          *)iter);
        local_158._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                    *)this_00);
        while (bVar7 = std::operator!=(&__end5,&local_158), bVar7) {
          name = &std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>
                  ::operator*(&__end5)->first;
          _ = (type *)std::get<0ul,std::__cxx11::string_const,SGParser::Generator::NFA*>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>
                                  *)name);
          local_170 = std::get<1ul,std::__cxx11::string_const,SGParser::Generator::NFA*>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>
                                  *)name);
          std::operator+(&local_1b0," \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_);
          std::operator+(&local_190,&local_1b0,'\'');
          std::__cxx11::string::operator+=((string *)&__range5,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>
          ::operator++(&__end5);
        }
        pLVar2 = this->pLex;
        uVar13 = std::__cxx11::string::data();
        sVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                         *)iter);
        uVar11 = std::__cxx11::string::data();
        Lex::CheckForErrorAndReport
                  (pLVar2,"Macro \'%s\' not defined; there are %zu known macros:%s",uVar13,sVar10,
                   uVar11);
        this_local._7_1_ = 0;
        pnfa._4_4_ = 1;
        std::__cxx11::string::~string((string *)&__range5);
      }
      else {
        ppVar12 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>
                  ::operator->(local_110);
        _code_1 = ppVar12->second;
        if (_code_1 == (NFA *)0x0) {
          pLVar2 = this->pLex;
          uVar13 = std::__cxx11::string::data();
          Lex::CheckForErrorAndReport
                    (pLVar2,"Invalid regular expression in macro \'%s\' used",uVar13);
          this_local._7_1_ = 0;
          pnfa._4_4_ = 1;
        }
        else {
          pNVar14 = (NFA *)operator_new(0x28);
          NFA::NFA(pNVar14,_code_1,this->LexemeID);
          pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
          (pRVar16->field_1).pNFA = pNVar14;
          pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
          pRVar16->DataType = NFA;
          pnfa._4_4_ = 2;
        }
      }
      std::__cxx11::string::~string((string *)&__range4);
      if (pnfa._4_4_ == 1) goto LAB_00192319;
      break;
    case 0x191f4b:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      code2 = (pRVar16->field_1).ch;
      pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar15);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pVec = pvVar15;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = Vector;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&code2);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&code2);
      break;
    case 0x191fe5:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      pvVar15 = (pRVar16->field_1).pVec;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar15,&(pRVar16->field_1).ch);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      pvVar15 = (pRVar16->field_1).pVec;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar15,&(pRVar16->field_1).ch);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      aVar3 = pRVar16->field_1;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->field_1 = aVar3;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      RVar1 = pRVar16->DataType;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = RVar1;
      break;
    case 0x1920ba:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      code_2 = (pRVar16->field_1).ch;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
      code2_1 = (pRVar16->field_1).ch;
      pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar15);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pVec = pvVar15;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = Vector;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&code_2);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&code2_1);
      break;
    case 0x19216b:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      code_3 = (pRVar16->field_1).ch;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
      local_1d4 = (pRVar16->field_1).ch;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&code_3);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&local_1d4);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,3);
      aVar3 = pRVar16->field_1;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->field_1 = aVar3;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,3);
      RVar1 = pRVar16->DataType;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = RVar1;
      break;
    case 0x192237:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      local_1d8 = (pRVar16->field_1).ch;
      pvVar15 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar15);
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      (pRVar16->field_1).pVec = pvVar15;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pRVar16->DataType = Vector;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pRVar16->field_1).pVec,&local_1d8);
      break;
    case 0x1922b1:
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
      pvVar15 = (pRVar16->field_1).pVec;
      pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar15,&(pRVar16->field_1).ch);
    }
  }
  else {
    pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar16->field_1).pNFA = (NFA *)0x0;
    pRVar16 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar16->DataType = Null;
  }
  this_local._7_1_ = 1;
LAB_00192319:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reduce(Parse<RegExprNFAParseElement>& parse, unsigned productionID) override {
        switch (productionID) {
            // RegExp --> RegExp  A
            case RE_RegExpConcat:
                // Make a NFA from A and B. Put in parseStack
                parse[0].pNFA->Concat(*parse[1].pNFA);
                parse[1].Destroy();
                break;

                // RegExp --> A
            case RE_RegExp:
                break;

                // A --> A '|' B
            case RE_AOr:
                // Make a NFA from A and B. Put in parseStack
                parse[0].pNFA->Or(*parse[2].pNFA);
                parse[2].Destroy();
                break;

                // A --> B
            case RE_A:
                break;

                // B --> B '*'
            case RE_BStar:
                // Make a NFA from A*
                parse[0].pNFA->Kleene(NFA::KleeneType::ConnectBoth);
                break;

                // B --> B '+'
            case RE_BPlus:
                // Make a NFA from A+
                parse[0].pNFA->Kleene(NFA::KleeneType::ConnectBack);
                break;

                // B --> B '?'
            case RE_BQuestion:
                // Make a NFA for one optional character
                parse[0].pNFA->Kleene(NFA::KleeneType::ConnectEmpty);
                break;

                // B --> C
            case RE_B:
                break;

                // C --> '(' RegExp ')'
            case RE_CParen:
                parse[0].pNFA     = parse[1].pNFA;
                parse[0].DataType = parse[1].DataType;
                break;

                // C --> character
            case RE_CChar:
                // Make an NFA from the character. Assign to parseStack
                parse[0].pNFA     = new NFA{parse[0].ch, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;

                // C --> '.'
            case RE_CDot: {
                // Construct a list of all characters but '\n'
                std::vector<unsigned> charList;
                charList.reserve(253u);
                for (unsigned k = 1u; k <= 255u; k++)
                    if (k != '\n' && k != '\r')
                        charList.push_back(k);

                // ...and then make the NFA
                parse[0].pNFA     = new NFA{charList, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

                // C --> '[' GroupSet ']'
            case RE_CGroupSet: {
                // Make a NFA out of the sequence
                const auto pgroupSet = parse[1].pVec;
                std::vector<unsigned> charList;

                // Construct a list of all the characters represented by the pgroupSet...
                for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                    for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                        charList.push_back(j);

                // Delete std::vector
                parse[1].Destroy();

                // ...and then make the NFA
                parse[0].pNFA     = new NFA{charList, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

                // C --> '[' '^' GroupSet ']'
            case RE_CNotGroupSet: {
                // Make a NFA out of the sequence
                const auto            pgroupSet = parse[2].pVec;
                std::vector<unsigned> charList;

                // Construct a list of all the characters NOT represented by the pgroupSet...
                // NOTE: Depends on 0..255 ASCII
                for (unsigned k = 1u; k <= 255u; ++k) {
                    bool f = false;
                    for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                        for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                            if (j == k)
                                f = true;

                    if (!f)
                        charList.push_back(k);
                }
                // Delete std::vector
                parse[2].Destroy();

                // ...and then make the NFA
                parse[0].pNFA     = new NFA{charList, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

                // C --> '{' CharSet '}'
            case RE_CCharSet: {
                // Generate a string from the char std::vector
                SG_ASSERT(parse[1].pVec);
                String macroName;
                macroName.reserve(parse[1].pVec->size());
                for (auto const& ord : *parse[1].pVec) {
                    macroName.push_back(char(ord));
                }

                // Delete the character std::vector
                parse[1].Destroy();

                // Try to find it in macro list
                SG_ASSERT(pMacroNFAs != nullptr);
                auto const& map = *pMacroNFAs;
                auto const& iter = map.find(macroName);
                if (iter == map.end()) {
                    std::string names;
                    for (auto const& [name, _] : map)
                        names += " '" + name + '\'';
                    pLex->CheckForErrorAndReport("Macro '%s' not defined; there are %zu known macros:%s",
                                                 macroName.data(), map.size(), names.data());
                    // Bad!
                    return false;
                }

                // Get the NFA from the Macros list
                const auto pnfa = iter->second;

                if (!pnfa) {
                    pLex->CheckForErrorAndReport("Invalid regular expression in macro '%s' used",
                                                 macroName.data());
                    // Bad!
                    return false;
                }

                parse[0].pNFA     = new NFA{*pnfa, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

            // GroupSet --> character
            case RE_GroupSetChar: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;

                parse[0].pVec     = new std::vector<unsigned>;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Vector;
                parse[0].pVec->push_back(code);
                parse[0].pVec->push_back(code);
                break;
            }

                // GroupSet --> character GroupSet
            case RE_GroupSetCharGroupSet:
                // Add the char to the end of the CharSet std::vector
                parse[1].pVec->push_back(parse[0].ch);
                parse[1].pVec->push_back(parse[0].ch);
                parse[0].pVec     = parse[1].pVec;
                parse[0].DataType = parse[1].DataType;
                break;

                // GroupSet --> character '-' character
            case RE_GroupSetCharList: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[0].pVec     = new std::vector<unsigned>;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Vector;
                parse[0].pVec->push_back(code);
                parse[0].pVec->push_back(code2);
                break;
            }

                // GroupSet --> character '-' character GroupSet
            case RE_GroupSetCharListGroupSet: {
                // Add the char to the end of the CharSet std::vector
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[3].pVec->push_back(code);
                parse[3].pVec->push_back(code2);
                parse[0].pVec     = parse[3].pVec;
                parse[0].DataType = parse[3].DataType;
                break;
            }

                // CharSet --> character
            case RE_CharSet: {
                // Get the code and add it to the new std::vector
                const auto code   = parse[0].ch;
                // Create a new std::vector of chars
                parse[0].pVec     = new std::vector<unsigned>;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Vector;
                parse[0].pVec->push_back(code);
                break;
            }

                // CharSet --> CharSet character
            case RE_CharSetChar:
                // Add the char to the end of the CharSet std::vector
                parse[0].pVec->push_back(parse[1].ch);
                break;

            default:
                parse[0].pNFA     = nullptr;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Null;
                break;
        }

        return true;
    }